

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

Error __thiscall asmjit::ZoneBitVector::_append(ZoneBitVector *this,ZoneHeap *heap,bool value)

{
  long *plVar1;
  long *plVar2;
  ZoneHeap *this_00;
  char cVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Error EVar6;
  undefined8 *puVar7;
  void *pvVar8;
  sbyte sVar9;
  sbyte sVar10;
  ulong uVar11;
  long *plVar12;
  uint uVar13;
  ulong newLength;
  ZoneHeap *extraout_RDX;
  long extraout_RDX_00;
  long *plVar14;
  long extraout_RDX_01;
  uint uVar15;
  ZoneBitVector *pZVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  size_t sStack_68;
  ZoneBitVector *pZStack_60;
  size_t sStack_38;
  
  uVar17 = *(ulong *)(this + 0x10);
  uVar11 = 0x80;
  if (0x7f < uVar17) {
    if (uVar17 < 0x4000001) {
      uVar11 = uVar17 * 2;
    }
    else {
      uVar11 = uVar17 + 0x4000000;
    }
  }
  newLength = *(long *)(this + 8) + 1;
  if ((uVar17 <= uVar11) || (uVar11 = newLength, uVar17 < newLength)) {
    EVar6 = _resize(this,heap,newLength,uVar11,value);
    return EVar6;
  }
  _append();
  if (extraout_RDX <= heap) {
    return (uint)(extraout_RDX < heap) + (uint)(extraout_RDX < heap) * 2;
  }
  if (*(ZoneHeap **)(this + 8) < heap) {
    fill();
LAB_00118fdd:
    fill();
LAB_00118fe2:
    fill();
  }
  else {
    if (*(ZoneHeap **)(this + 8) < extraout_RDX) goto LAB_00118fdd;
    this = *(ZoneBitVector **)this;
    if (this == (ZoneBitVector *)0x0) goto LAB_00118fe2;
    cVar3 = (char)newLength;
    uVar11 = (ulong)heap >> 6;
    uVar15 = (uint)heap & 0x3f;
    heap = (ZoneHeap *)(ulong)uVar15;
    uVar17 = (ulong)extraout_RDX >> 6;
    uVar13 = (uint)extraout_RDX & 0x3f;
    sVar9 = (sbyte)uVar13;
    if (heap == (ZoneHeap *)0x0) {
LAB_00118ef0:
      auVar5 = _DAT_00132b70;
      auVar4 = _DAT_00132b60;
      lVar18 = uVar17 - uVar11;
      if (uVar11 <= uVar17 && lVar18 != 0) {
        lVar19 = lVar18 + -1;
        auVar21._8_4_ = (int)lVar19;
        auVar21._0_8_ = lVar19;
        auVar21._12_4_ = (int)((ulong)lVar19 >> 0x20);
        uVar20 = 0;
        auVar21 = auVar21 ^ _DAT_00132b70;
        do {
          auVar22._8_4_ = (int)uVar20;
          auVar22._0_8_ = uVar20;
          auVar22._12_4_ = (int)(uVar20 >> 0x20);
          auVar22 = (auVar22 | auVar4) ^ auVar5;
          if ((bool)(~(auVar22._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar22._0_4_ ||
                      auVar21._4_4_ < auVar22._4_4_) & 1)) {
            *(ulong *)(this + uVar20 * 8 + uVar11 * 8) = -(newLength & 0xff);
          }
          if ((auVar22._12_4_ != auVar21._12_4_ || auVar22._8_4_ <= auVar21._8_4_) &&
              auVar22._12_4_ <= auVar21._12_4_) {
            *(ulong *)(this + uVar20 * 8 + uVar11 * 8 + 8) = -(newLength & 0xff);
          }
          uVar20 = uVar20 + 2;
        } while ((lVar18 + 1U & 0xfffffffffffffffe) != uVar20);
      }
      if (((ulong)extraout_RDX & 0x3f) != 0) {
        uVar11 = -1L << sVar9;
        if (cVar3 == '\0') {
          *(ulong *)(this + uVar17 * 8) = *(ulong *)(this + uVar17 * 8) & uVar11;
        }
        else {
          *(ulong *)(this + uVar17 * 8) = *(ulong *)(this + uVar17 * 8) | ~uVar11;
        }
      }
      return 0;
    }
    sVar10 = (sbyte)uVar15;
    if (uVar11 != uVar17) {
      if (cVar3 == '\0') {
        *(ulong *)(this + uVar11 * 8) = *(ulong *)(this + uVar11 * 8) & ~(-1L << sVar10);
      }
      else {
        *(ulong *)(this + uVar11 * 8) = *(ulong *)(this + uVar11 * 8) | -1L << sVar10;
      }
      uVar11 = uVar11 + 1;
      goto LAB_00118ef0;
    }
    if (uVar15 < uVar13) {
      uVar17 = ~(-1L << (sVar9 - sVar10 & 0x3fU)) << sVar10;
      if (cVar3 == '\0') {
        *(ulong *)(this + uVar11 * 8) = *(ulong *)(this + uVar11 * 8) & ~uVar17;
      }
      else {
        *(ulong *)(this + uVar11 * 8) = *(ulong *)(this + uVar11 * 8) | uVar17;
      }
      return 0;
    }
  }
  fill();
  plVar1 = *(long **)this;
  if (plVar1 != (long *)0x0) {
    if (*(long **)(this + 8) != (long *)0x0) {
      if (*plVar1 == 0) {
        pZVar16 = this;
        ZoneStackBase::_init();
        this_00 = *(ZoneHeap **)pZVar16;
        pZStack_60 = this;
        if (this_00 == (ZoneHeap *)0x0) {
          ZoneStackBase::_prepareBlock();
        }
        else {
          uVar11 = (ulong)heap & 0xffffffff;
          lVar18 = *(long *)(pZVar16 + uVar11 * 8 + 8);
          if (*(long *)(lVar18 + 0x10) != *(long *)(lVar18 + 0x18)) {
            if (this_00->_zone != (Zone *)0x0) {
              pvVar8 = ZoneHeap::_alloc(this_00,0x200,&sStack_68);
              if (pvVar8 == (void *)0x0) {
                return 1;
              }
              *(undefined8 *)((long)pvVar8 + uVar11 * 8) = 0;
              *(long *)((long)pvVar8 + (ulong)((int)heap == 0) * 8) = lVar18;
              *(long *)((long)pvVar8 + 0x10) = extraout_RDX_01 + (long)pvVar8;
              *(long *)((long)pvVar8 + 0x18) = extraout_RDX_01 + (long)pvVar8;
              *(void **)(lVar18 + uVar11 * 8) = pvVar8;
              *(void **)(pZVar16 + uVar11 * 8 + 8) = pvVar8;
              return 0;
            }
            goto LAB_00119122;
          }
        }
        ZoneStackBase::_prepareBlock();
LAB_00119122:
        ZoneStackBase::_prepareBlock();
        return 1;
      }
      plVar2 = *(long **)(this + 8);
      plVar14 = (long *)plVar1[10];
      do {
        plVar12 = plVar2;
        plVar2 = (long *)plVar12[1];
        *plVar12 = (long)plVar14;
        plVar1[10] = (long)plVar12;
        plVar14 = plVar12;
      } while (plVar2 != (long *)0x0);
    }
    *(long *)this = 0;
    *(long *)(this + 8) = 0;
    *(long *)(this + 0x10) = 0;
  }
  EVar6 = 0;
  if (heap != (ZoneHeap *)0x0) {
    if (heap->_zone == (Zone *)0x0) {
      ZoneStackBase::_init();
    }
    else {
      puVar7 = (undefined8 *)ZoneHeap::_alloc(heap,0x200,&sStack_38);
      if (puVar7 != (undefined8 *)0x0) {
        *puVar7 = 0;
        puVar7[1] = 0;
        puVar7[2] = extraout_RDX_00 + (long)puVar7;
        puVar7[3] = extraout_RDX_00 + (long)puVar7;
        *(ZoneHeap **)this = heap;
        *(undefined8 **)(this + 8) = puVar7;
        *(undefined8 **)(this + 0x10) = puVar7;
        return 0;
      }
    }
    EVar6 = 1;
  }
  return EVar6;
}

Assistant:

Error ZoneBitVector::_append(ZoneHeap* heap, bool value) noexcept {
  size_t kThreshold = Globals::kAllocThreshold * 8;
  size_t newLength = _length + 1;
  size_t idealCapacity = _capacity;

  if (idealCapacity < 128)
    idealCapacity = 128;
  else if (idealCapacity <= kThreshold)
    idealCapacity *= 2;
  else
    idealCapacity += kThreshold;

  if (ASMJIT_UNLIKELY(idealCapacity < _capacity)) {
    // It's technically impossible that `_length + 1` overflows.
    idealCapacity = newLength;
    ASMJIT_ASSERT(idealCapacity > _capacity);
  }

  return _resize(heap, newLength, idealCapacity, value);
}